

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode cw_raw_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  Curl_cwriter *pCVar1;
  CURLcode CVar2;
  
  if ((((type & 1U) != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     (((data->req).field_0xda & 4) == 0)) {
    Curl_debug(data,CURLINFO_DATA_IN,buf,nbytes);
  }
  pCVar1 = writer->next;
  if (pCVar1 != (Curl_cwriter *)0x0) {
    CVar2 = (*pCVar1->cwt->do_write)(data,pCVar1,type,buf,nbytes);
    return CVar2;
  }
  return CURLE_WRITE_ERROR;
}

Assistant:

static CURLcode cw_raw_write(struct Curl_easy *data,
                             struct Curl_cwriter *writer, int type,
                             const char *buf, size_t nbytes)
{
  if(type & CLIENTWRITE_BODY && data->set.verbose && !data->req.ignorebody) {
    Curl_debug(data, CURLINFO_DATA_IN, (char *)buf, nbytes);
  }
  return Curl_cwriter_write(data, writer->next, type, buf, nbytes);
}